

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64_t __thiscall google::protobuf::internal::ThreadSafeArena::SpaceUsed(ThreadSafeArena *this)

{
  long lVar1;
  AllocationPolicy *pAVar2;
  long lVar3;
  long local_18;
  uint64_t space_used;
  ThreadSafeArena *this_local;
  
  local_18 = 0x78;
  space_used = (uint64_t)this;
  VisitSerialArena<google::protobuf::internal::ThreadSafeArena::SpaceUsed()const::__0>
            (this,(anon_class_8_1_bb8cb114)&local_18);
  lVar1 = local_18;
  pAVar2 = TaggedAllocationPolicyPtr::get(&this->alloc_policy_);
  lVar3 = 0;
  if (pAVar2 != (AllocationPolicy *)0x0) {
    lVar3 = 0x20;
  }
  return lVar1 - lVar3;
}

Assistant:

uint64_t ThreadSafeArena::SpaceUsed() const {
  // `first_arena_` doesn't have kSerialArenaSize overhead, so adjust it here.
  uint64_t space_used = kSerialArenaSize;
  VisitSerialArena([&space_used](const SerialArena* serial) {
    // SerialArena on chunks directly allocated from the block and needs to be
    // subtracted from SpaceUsed.
    space_used += serial->SpaceUsed() - kSerialArenaSize;
  });
  return space_used - (alloc_policy_.get() ? sizeof(AllocationPolicy) : 0);
}